

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

bool __thiscall ot::commissioner::coap::Message::IsTokenEqual(Message *this,Message *aMessage)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  allocator_type local_49;
  void *local_48;
  void *local_40;
  void *local_30;
  long local_28;
  
  bVar1 = *(byte *)&this->mHeader >> 4;
  uVar2 = (uint)bVar1;
  if (7 < bVar1) {
    uVar2 = 8;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,(this->mHeader).mToken
             ,(this->mHeader).mToken + uVar2,(allocator_type *)&local_30);
  bVar1 = *(byte *)&aMessage->mHeader >> 4;
  uVar2 = 8;
  if (bVar1 < 8) {
    uVar2 = (uint)bVar1;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_30,
             (aMessage->mHeader).mToken,(aMessage->mHeader).mToken + uVar2,&local_49);
  if ((long)local_40 - (long)local_48 == local_28 - (long)local_30) {
    if (local_40 == local_48) {
      bVar4 = true;
    }
    else {
      iVar3 = bcmp(local_48,local_30,(long)local_40 - (long)local_48);
      bVar4 = iVar3 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (local_30 != (void *)0x0) {
    operator_delete(local_30);
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48);
  }
  return bVar4;
}

Assistant:

bool Message::IsTokenEqual(const Message &aMessage) const
{
    return GetToken() == aMessage.GetToken();
}